

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_mipmapped_texture.cpp
# Opt level: O0

bool __thiscall crnlib::mip_level::can_unflip_without_unpacking(mip_level *this)

{
  bool bVar1;
  bool can_unflip;
  mip_level *this_local;
  
  bVar1 = is_valid(this);
  if (bVar1) {
    bVar1 = is_packed(this);
    if (bVar1) {
      this_local._7_1_ = true;
      if ((this->m_orient_flags & cOrientationFlagXFlipped) != cDefaultOrientationFlags) {
        this_local._7_1_ = dxt_image::can_flip(this->m_pDXTImage,0);
      }
      if (((this->m_orient_flags & cOrientationFlagYFlipped) != cDefaultOrientationFlags) &&
         (bVar1 = dxt_image::can_flip(this->m_pDXTImage,1), !bVar1)) {
        this_local._7_1_ = false;
      }
    }
    else {
      this_local._7_1_ = true;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool mip_level::can_unflip_without_unpacking() const {
  if (!is_valid())
    return false;

  if (!is_packed())
    return true;

  bool can_unflip = true;
  if (m_orient_flags & cOrientationFlagXFlipped) {
    if (!m_pDXTImage->can_flip(0))
      can_unflip = false;
  }
  if (m_orient_flags & cOrientationFlagYFlipped) {
    if (!m_pDXTImage->can_flip(1))
      can_unflip = false;
  }

  return can_unflip;
}